

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O1

DdNode * Cudd_bddSqueeze(DdManager *dd,DdNode *l,DdNode *u)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  DdNode *node;
  
  do {
    dd->reordered = 0;
    node = cuddBddSqueeze(dd,l,u);
  } while (dd->reordered == 1);
  if (node == (DdNode *)0x0) {
    node = (DdNode *)0x0;
  }
  else {
    iVar2 = Cudd_DagSize(node);
    iVar3 = Cudd_DagSize(u);
    if (iVar3 <= iVar2) {
      piVar1 = (int *)(((ulong)node & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_IterDerefBdd(dd,node);
      node = u;
      iVar2 = iVar3;
    }
    iVar3 = Cudd_DagSize(l);
    if (iVar3 <= iVar2) {
      piVar1 = (int *)(((ulong)node & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_IterDerefBdd(dd,node);
      node = l;
    }
  }
  return node;
}

Assistant:

DdNode *
Cudd_bddSqueeze(
  DdManager * dd /* manager */,
  DdNode * l /* lower bound */,
  DdNode * u /* upper bound */)
{
    DdNode *res;
    int sizeRes, sizeL, sizeU;

    do {
        dd->reordered = 0;
        res = cuddBddSqueeze(dd,l,u);
    } while (dd->reordered == 1);
    if (res == NULL) return(NULL);
    /* We now compare the result with the bounds and return the smallest.
    ** We first compare to u, so that in case l == 0 and u == 1, we return
    ** 0 as in other minimization algorithms. */
    sizeRes = Cudd_DagSize(res);
    sizeU = Cudd_DagSize(u);
    if (sizeU <= sizeRes) {
        cuddRef(res);
        Cudd_IterDerefBdd(dd,res);
        res = u;
        sizeRes = sizeU;
    }
    sizeL = Cudd_DagSize(l);
    if (sizeL <= sizeRes) {
        cuddRef(res);
        Cudd_IterDerefBdd(dd,res);
        res = l;
        sizeRes = sizeL;
    }
    return(res);

}